

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_free(void)

{
  fsnav_plugin *__ptr;
  char *__ptr_00;
  fsnav_air *__ptr_01;
  double *__ptr_02;
  fsnav_struct *pfVar1;
  long lVar2;
  ulong uVar3;
  
  pfVar1 = fsnav;
  __ptr = (fsnav->core).plugins;
  if (__ptr != (fsnav_plugin *)0x0) {
    free(__ptr);
    (pfVar1->core).plugins = (fsnav_plugin *)0x0;
  }
  pfVar1 = fsnav;
  (fsnav->core).plugin_count = 0;
  __ptr_00 = pfVar1->cfg;
  if (__ptr_00 != (char *)0x0) {
    free(__ptr_00);
    pfVar1->cfg = (char *)0x0;
  }
  pfVar1 = fsnav;
  fsnav->cfglength = 0;
  pfVar1->cfg_settings = (char *)0x0;
  pfVar1->settings_length = 0;
  fsnav_free_imu();
  if (fsnav->gnss != (fsnav_gnss *)0x0) {
    if (fsnav->gnss_count != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        fsnav_free_gnss((fsnav_gnss *)((long)(fsnav->gnss->settings).ant_pos + lVar2 + -0x40));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x1d8;
      } while (uVar3 < fsnav->gnss_count);
    }
    free(fsnav->gnss);
    fsnav->gnss = (fsnav_gnss *)0x0;
  }
  pfVar1 = fsnav;
  fsnav->gnss_count = 0;
  if (pfVar1->air != (fsnav_air *)0x0) {
    pfVar1->air->cfg = (char *)0x0;
    __ptr_01 = fsnav->air;
    __ptr_01->cfglength = 0;
    free(__ptr_01);
  }
  fsnav_free_ref();
  pfVar1 = fsnav;
  __ptr_02 = (fsnav->sol).metrics;
  if (__ptr_02 != (double *)0x0) {
    free(__ptr_02);
    (pfVar1->sol).metrics = (double *)0x0;
  }
  return;
}

Assistant:

void fsnav_free()
{
	size_t r;

	// core
	fsnav_free_null((void**)(&(fsnav->core.plugins)));
	fsnav->core.plugin_count = 0;

	// configuration string
	fsnav_free_null((void**)(&(fsnav->cfg)));
	fsnav->cfglength = 0;
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;

	// imu
	fsnav_free_imu();

	// gnss
	if (fsnav->gnss != NULL) {
		for (r = 0; r < fsnav->gnss_count; r++)
			fsnav_free_gnss(&(fsnav->gnss[r]));
		free((void*)(fsnav->gnss));
		fsnav->gnss = NULL;
	}
	fsnav->gnss_count = 0;

	// air data
	fsnav_free_air();

	// reference data
	fsnav_free_ref();

	// solution
	fsnav_free_sol(&(fsnav->sol));
}